

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
::reject(AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
         *this,Exception *exception)

{
  undefined8 uVar1;
  ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client> local_1d8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1d8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (exception->remoteTrace).content.ptr;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         (exception->remoteTrace).content.size_;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy((void *)((long)&local_1d8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           exception->trace,0x105);
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         (exception->details).builder.ptr;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (exception->details).builder.pos;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (exception->details).builder.endPtr;
    local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d8.value.ptr.isSet = false;
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::operator=
              (&this->result,&local_1d8);
    uVar1 = local_1d8.value.ptr.field_1._16_8_;
    if ((local_1d8.value.ptr.isSet == true) &&
       ((long *)local_1d8.value.ptr.field_1._16_8_ != (long *)0x0)) {
      local_1d8.value.ptr.field_1._16_8_ = (long *)0x0;
      (*(code *)**(undefined8 **)local_1d8.value.ptr.field_1._8_8_)
                (local_1d8.value.ptr.field_1._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    }
    if (local_1d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }